

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall
PermutationElement_UniformDelta_Test::TestBody(PermutationElement_UniformDelta_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int *args_2;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001304 [12];
  int n;
  int local_cc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  int local_bc;
  ulong local_b8;
  float local_b0;
  int local_ac;
  int va;
  undefined4 uStack_a4;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<int,_std::allocator<int>_> count;
  int vb;
  undefined4 uStack_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  AssertHelper local_48;
  AssertionResult gtest_ar_;
  
  local_50 = 0;
  do {
    n = *(int *)((long)&DAT_0056ef30 + local_50);
    std::vector<int,_std::allocator<int>_>::vector
              (&count,(ulong)(uint)(n * n),(allocator_type *)&va);
    uVar11 = n * 60000;
    if (0 < n) {
      local_b8 = 1;
      if (1 < (int)uVar11) {
        local_b8 = (ulong)uVar11;
      }
      uVar9 = 0;
      do {
        if (0 < n) {
          lVar6 = (uVar9 * 0x7fb5d329728ea185 >> 0x1b ^ uVar9 * 0x7fb5d329728ea185) *
                  -0x7e25210b43d22bb3;
          uVar10 = (uint)((ulong)lVar6 >> 0x21) ^ (uint)lVar6;
          uVar5 = 0;
          do {
            uVar7 = n - 1U >> 1 | n - 1U;
            uVar7 = uVar7 >> 2 | uVar7;
            uVar7 = uVar7 >> 4 | uVar7;
            uVar7 = uVar7 >> 8 | uVar7;
            uVar7 = uVar7 >> 0x10 | uVar7;
            uVar4 = uVar5;
            do {
              uVar4 = (uVar4 ^ uVar10) * -0x1e8f76c3 ^ uVar10 >> 0x10;
              uVar4 = ((uVar4 & uVar7) >> 4 ^ uVar10 >> 8 ^ uVar4) * 0x929eb3f ^ uVar10 >> 0x17;
              uVar4 = ((uVar4 & uVar7) >> 1 ^ uVar4) * (uVar10 >> 0x1b | 1) * 0x6935fa69;
              uVar4 = ((uVar4 & uVar7) >> 0xb ^ uVar4) * 0x74dcb303;
              uVar4 = ((uVar4 & uVar7) >> 2 ^ uVar4) * -0x61afe33d;
              uVar4 = ((uVar4 & uVar7) >> 2 ^ uVar4) * -0x379f5c21 & uVar7;
              uVar4 = uVar4 >> 5 ^ uVar4;
            } while ((uint)n <= uVar4);
            iVar8 = (uVar4 + uVar10) % (uint)n - uVar5;
            iVar8 = (iVar8 >> 0x1f & n) + iVar8;
            va = iVar8;
            vb = n;
            if (n <= iVar8) {
              pbrt::
              LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],int&,char_const(&)[2],int&>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                         ,0x3b3,"Check failed: %s < %s with %s = %s, %s = %s",
                         (char (*) [6])0x2e4217f,(char (*) [2])0x5702ad,(char (*) [6])0x2e4217f,&va,
                         (char (*) [2])0x5702ad,&vb);
            }
            count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(int)(iVar8 * n + uVar5)] =
                 count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[(int)(iVar8 * n + uVar5)] + 1;
            uVar5 = uVar5 + 1;
          } while ((int)uVar5 < n);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != local_b8);
    }
    local_cc = 0;
    if (0 < n) {
      local_b8 = CONCAT44(local_b8._4_4_,(float)(int)uVar11 * 0.97);
      local_b0 = (float)(int)uVar11 * 1.03;
      do {
        local_bc = 0;
        if (0 < n) {
          do {
            lVar6 = (long)(local_bc * n) + (long)local_cc;
            auVar12._0_4_ =
                 (float)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6];
            auVar12._4_12_ = in_register_00001304;
            auVar13._0_4_ = (float)local_b8 / (float)n;
            auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
            uVar1 = vcmpps_avx512vl(auVar13,auVar12,2);
            uVar2 = vcmpps_avx512vl(auVar12,ZEXT416((uint)(local_b0 / (float)n)),2);
            gtest_ar_.success_ = (bool)((byte)uVar1 & (byte)uVar2 & 1);
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_c8);
              local_ac = (int)uVar11 / n;
              local_a0 = 0;
              local_98._M_local_buf[0] = '\0';
              args_2 = &n;
              _va = (pointer)&local_98;
              pbrt::detail::stringPrintfRecursive<int&,int&,int&,int&,int>
                        ((string *)&va,
                         "Got count %d for %d -> %d (perm size %d). Expected +/- %d.\n",
                         count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar6,&local_cc,&local_bc,args_2,
                         &local_ac);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_c8.ptr_ + 0x10),_va,local_a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&vb,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "count[offset] >= (1 - tol) * numIters / n && count[offset] <=(1 + tol) * numIters / n"
                         ,"false","true",(char *)args_2);
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                         ,0x3be,(char *)CONCAT44(uStack_6c,vb));
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(uStack_6c,vb) != &local_60) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(uStack_6c,vb),local_60._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_va != &local_98) {
                operator_delete(_va,CONCAT71(local_98._M_allocated_capacity._1_7_,
                                             local_98._M_local_buf[0]) + 1);
              }
              if (local_c8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   (local_c8.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_c8.ptr_ + 8))();
                }
                local_c8.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_bc = local_bc + 1;
          } while (local_bc < n);
        }
        local_cc = local_cc + 1;
      } while (local_cc < n);
    }
    if (count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_50 = local_50 + 4;
  } while (local_50 != 0x28);
  return;
}

Assistant:

TEST(PermutationElement, UniformDelta) {
    for (int n : { 2, 3, 4, 5, 9, 14, 16, 22, 27, 36 }) {
        std::vector<int> count(n * n);

        int numIters = 60000 * n;
        for (int seed = 0; seed < numIters; ++seed) {
            for (int i = 0; i < n; ++i) {
                int ip = PermutationElement(i, n, MixBits(seed));
                int delta = ip - i;
                if (delta < 0) delta += n;
                CHECK_LT(delta, n);
                int offset = delta * n + i;
                ++count[offset];
            }
        }

        for (int i = 0; i < n; ++i) {
            for (int j = 0; j < n; ++j) {
                Float tol = 0.03f;
                int offset = j * n + i;
                EXPECT_TRUE(count[offset] >= (1 - tol) * numIters / n &&
                            count[offset] <=(1 + tol) * numIters / n) <<
                StringPrintf("Got count %d for %d -> %d (perm size %d). Expected +/- %d.\n",
                                 count[offset], i, j, n, numIters / n);
            }
        }
    }
}